

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::cftrec4(int n,double *a,int nw,double *w)

{
  int iVar1;
  int iVar2;
  double *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  int in_EDI;
  int m;
  int k;
  int j;
  int isplt;
  double *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  int nw_00;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  iVar1 = in_EDI;
  while (0x200 < iVar1) {
    iVar1 = iVar1 >> 2;
    cftmdl1(in_stack_ffffffffffffffdc,(double *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),
            in_stack_ffffffffffffffc8);
  }
  cftleaf((int)((ulong)in_RCX >> 0x20),(int)in_RCX,
          (double *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
          in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  nw_00 = 0;
  for (iVar2 = in_EDI - iVar1; 0 < iVar2; iVar2 = iVar2 - iVar1) {
    nw_00 = nw_00 + 1;
    in_stack_ffffffffffffffdc =
         cfttree((int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX,in_RCX,in_stack_ffffffffffffffdc,
                 (double *)CONCAT44(nw_00,iVar1));
    cftleaf((int)((ulong)in_RCX >> 0x20),(int)in_RCX,
            (double *)CONCAT44(in_stack_ffffffffffffffdc,iVar2),nw_00,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void cftrec4(int n, double *a, int nw, double *w) {
#if 0
  int cfttree(int n, int j, int k, double *a, int nw, double *w);
  void cftleaf(int n, int isplt, double *a, int nw, double *w);
  void cftmdl1(int n, double *a, double *w);
#endif
  int isplt, j, k, m;

  m = n;
  while (m > 512) {
    m >>= 2;
    cftmdl1(m, &a[n - m], &w[nw - (m >> 1)]);
  }
  cftleaf(m, 1, &a[n - m], nw, w);
  k = 0;
  for (j = n - m; j > 0; j -= m) {
    k++;
    isplt = cfttree(m, j, k, a, nw, w);
    cftleaf(m, isplt, &a[j - m], nw, w);
  }
}